

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O3

bool __thiscall Cache::cacheSetFull(Cache *this,uint32_t set_id)

{
  uint32_t uVar1;
  bool *pbVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  pointer pBVar6;
  long lVar7;
  bool bVar8;
  
  uVar1 = (this->policy).associativity;
  bVar8 = true;
  uVar5 = set_id * uVar1;
  if (uVar5 < uVar5 + uVar1) {
    pBVar6 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = (ulong)uVar5;
    if (pBVar6[uVar4].valid != true) {
      return false;
    }
    pBVar6 = pBVar6 + uVar4 + 1;
    lVar3 = 0;
    do {
      lVar7 = lVar3;
      if (1 - uVar1 == (int)lVar7) break;
      pbVar2 = &pBVar6->valid;
      pBVar6 = pBVar6 + 1;
      lVar3 = lVar7 + -1;
    } while (*pbVar2 != false);
    bVar8 = (ulong)(uVar5 + uVar1) <= (uVar4 - lVar7) + 1;
  }
  return bVar8;
}

Assistant:

bool Cache::cacheSetFull(uint32_t set_id) const {
    uint32_t begin = set_id * this->policy.associativity;
    uint32_t end = begin + this->policy.associativity;
    for (uint32_t i = begin; i < end; i++) {
        if (!this->blocks[i].valid)
            return false;
    }
    return true;
}